

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O0

void object_kind_name(char *buf,size_t max,object_kind *kind,_Bool easy_know)

{
  _Bool easy_know_local;
  object_kind *kind_local;
  size_t max_local;
  char *buf_local;
  
  if (((easy_know) || ((kind->aware & 1U) != 0)) || (kind->flavor == (flavor *)0x0)) {
    obj_desc_name_format(buf,max,0,kind->name,(char *)0x0,false);
  }
  else {
    my_strcpy(buf,kind->flavor->text,max);
  }
  return;
}

Assistant:

void object_kind_name(char *buf, size_t max, const struct object_kind *kind,
					  bool easy_know)
{
	/* If not aware, the plain flavour (e.g. Copper) will do. */
	if (!easy_know && !kind->aware && kind->flavor)
		my_strcpy(buf, kind->flavor->text, max);

	/* Use proper name (Healing, or whatever) */
	else
		(void) obj_desc_name_format(buf, max, 0, kind->name, NULL, false);
}